

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledInputFile.cpp
# Opt level: O0

bool __thiscall
Imf_3_4::TiledInputFile::isValidTile(TiledInputFile *this,int dx,int dy,int lx,int ly)

{
  int iVar1;
  exr_context_t p_Var2;
  element_type *peVar3;
  undefined4 in_ECX;
  int in_EDX;
  int in_ESI;
  undefined4 in_R8D;
  int32_t county;
  int32_t countx;
  bool local_3a;
  bool local_39;
  int local_28;
  int local_24;
  undefined4 local_20;
  undefined4 local_1c;
  int local_18;
  int local_14;
  bool local_1;
  
  local_24 = 0;
  local_28 = 0;
  local_20 = in_R8D;
  local_1c = in_ECX;
  local_18 = in_EDX;
  local_14 = in_ESI;
  p_Var2 = Context::operator_cast_to__priv_exr_context_t_((Context *)0x236909);
  peVar3 = std::
           __shared_ptr_access<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Imf_3_4::TiledInputFile::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x23691c);
  iVar1 = exr_get_tile_counts(p_Var2,peVar3->partNumber,local_1c,local_20,&local_24,&local_28);
  if (iVar1 == 0) {
    local_39 = false;
    if ((local_14 < local_24) && (local_39 = false, -1 < local_14)) {
      local_3a = local_18 < local_28 && -1 < local_18;
      local_39 = local_3a;
    }
    local_1 = local_39;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool
TiledInputFile::isValidTile (int dx, int dy, int lx, int ly) const
{
    int32_t countx = 0, county = 0;
    if (EXR_ERR_SUCCESS == exr_get_tile_counts (
            _ctxt, _data->partNumber, lx, ly, &countx, &county))
    {
        // get tile counts will check lx, ly for us
        return ((dx < countx && dx >= 0) &&
                (dy < county && dy >= 0));
    }
    return false;
}